

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

int Sdb_StoDiffExactlyOne(Vec_Wec_t *vCuts,int Limit,int *pCut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = (ulong)vCuts->nSize;
  if ((long)uVar4 < 1) {
    return -1;
  }
  uVar2 = *pCut + 1;
  uVar6 = 0;
  do {
    if (*pCut < 1) {
      uVar7 = 1;
    }
    else {
      uVar1 = vCuts->pArray[uVar6].nSize;
      uVar7 = 1;
      while (0 < (int)uVar1) {
        uVar8 = 0;
        while (vCuts->pArray[uVar6].pArray[uVar8] != pCut[uVar7]) {
          uVar8 = uVar8 + 1;
          if (uVar1 == uVar8) goto LAB_0068b27d;
        }
        uVar7 = uVar7 + 1;
        if (uVar7 == uVar2) {
          return -1;
        }
      }
    }
LAB_0068b27d:
    if ((uint)uVar7 == uVar2) {
      return -1;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != uVar4);
  if (0 < vCuts->nSize) {
    uVar6 = 0;
    do {
      if (uVar6 == (uint)Limit) {
        return -1;
      }
      if (0 < *pCut) {
        uVar2 = vCuts->pArray[uVar6].nSize;
        uVar7 = (ulong)(uint)*pCut + 1;
        uVar8 = 1;
        iVar3 = -1;
        do {
          if (0 < (int)uVar2) {
            uVar9 = 0;
            do {
              iVar5 = iVar3;
              if (vCuts->pArray[uVar6].pArray[uVar9] == pCut[uVar8]) goto LAB_0068b2ea;
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          iVar5 = pCut[uVar8];
          if (iVar3 != -1) goto LAB_0068b2f9;
LAB_0068b2ea:
          uVar8 = uVar8 + 1;
          iVar3 = iVar5;
        } while (uVar8 != uVar7);
        uVar8 = uVar7 & 0xffffffff;
LAB_0068b2f9:
        if (((int)uVar8 == (int)uVar7) && (iVar3 != -1)) {
          return iVar3;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
  }
  return -1;
}

Assistant:

int Sdb_StoDiffExactlyOne( Vec_Wec_t * vCuts, int Limit, int * pCut )
{
    Vec_Int_t * vCut;  
    int i, k, iNew;
    // check if it is fully contained in any one
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        for ( k = 1; k <= pCut[0]; k++ )
            if ( Vec_IntFind(vCut, pCut[k]) == -1 )
                break;
        if ( k == pCut[0] + 1 )
            return -1;
    }
    // check if there is one different
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        if ( i == Limit )
            break;
        for ( iNew = -1, k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
            return iNew;
    }
    return -1;
}